

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

bool Clasp::Cli::ClaspAppOptions::mappedOpts(ClaspAppOptions *this_,string *name,string *value)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char *err;
  uint32 q [3];
  char *local_30;
  uint local_28 [4];
  
  bVar4 = std::operator==(name,"quiet");
  if (bVar4) {
    local_30 = (char *)0x0;
    local_28[0] = 0xff;
    local_28[1] = 0xff;
    local_28[2] = 0xff;
    uVar5 = Potassco::xconvert<unsigned_int,3>
                      ((value->_M_dataplus)._M_p,(uint (*) [3])local_28,&local_30,0);
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      this_->quiet[uVar7] = (uint8)local_28[uVar7];
    }
    if ((ulong)uVar5 != 0) {
      return *local_30 == '\0';
    }
LAB_001134ac:
    bVar4 = false;
  }
  else {
    bVar4 = std::operator==(name,"out-ifs");
    if (bVar4) {
      if (value->_M_string_length - 3 < 0xfffffffffffffffe) goto LAB_001134ac;
      pcVar2 = (value->_M_dataplus)._M_p;
      if (value->_M_string_length == 1) {
        this_->ifs = *pcVar2;
      }
      else {
        cVar1 = pcVar2[1];
        if (cVar1 == '\\') {
          this_->ifs = '\\';
        }
        else if (cVar1 == 'n') {
          this_->ifs = '\n';
        }
        else if (cVar1 == 'v') {
          this_->ifs = '\v';
        }
        else {
          if (cVar1 != 't') goto LAB_001134ac;
          this_->ifs = '\t';
        }
      }
    }
    else {
      bVar4 = std::operator==(name,"lemma-out-dom");
      if (bVar4) {
        pcVar3 = (value->_M_dataplus)._M_p;
        iVar6 = strcasecmp(pcVar3,"output");
        (this_->lemma).domOut = iVar6 == 0;
        if (iVar6 != 0) {
          iVar6 = strcasecmp(pcVar3,"input");
          return iVar6 == 0;
        }
      }
      else {
        bVar4 = std::operator==(name,"pre");
        if (!bVar4) goto LAB_001134ac;
        pcVar3 = (value->_M_dataplus)._M_p;
        iVar6 = strcasecmp(pcVar3,"aspif");
        if (iVar6 == 0) {
          this_->onlyPre = '\x01';
        }
        else {
          iVar6 = strcasecmp(pcVar3,"smodels");
          if (iVar6 != 0) goto LAB_001134ac;
          this_->onlyPre = -1;
        }
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ClaspAppOptions::mappedOpts(ClaspAppOptions* this_, const std::string& name, const std::string& value) {
	if (name == "quiet") {
		const char* err = 0;
		uint32      q[3]= {uint32(UCHAR_MAX),uint32(UCHAR_MAX),uint32(UCHAR_MAX)};
		int      parsed = Potassco::xconvert(value.c_str(), q, &err);
		for (int i = 0; i != parsed; ++i) { this_->quiet[i] = static_cast<uint8>(q[i]); }
		return parsed && *err == 0;
	}
	else if (name == "out-ifs") {
		if (value.empty() || value.size() > 2) { return false;}
		if (value.size() == 1) { this_->ifs = value[0]; return true; }
		if (value[1] == 't')   { this_->ifs = '\t'; return true; }
		if (value[1] == 'n')   { this_->ifs = '\n'; return true; }
		if (value[1] == 'v')   { this_->ifs = '\v'; return true; }
		if (value[1] == '\\')  { this_->ifs = '\\'; return true; }
	}
	else if (name == "lemma-out-dom") {
		return (this_->lemma.domOut = (strcasecmp(value.c_str(), "output") == 0)) == true || strcasecmp(value.c_str(), "input") == 0;
	}
	else if (name == "pre") {
		if      (strcasecmp(value.c_str(), "aspif")   == 0) { this_->onlyPre = (int8)AspParser::format_aspif; return true; }
		else if (strcasecmp(value.c_str(), "smodels") == 0) { this_->onlyPre = (int8)AspParser::format_smodels; return true; }
	}
	return false;
}